

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O0

void __thiscall
Eigen::
DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,1,-1,false>>
::
swap<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,1,_1,false>>
          (DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,1,_1,false>>
           *this,DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
                 *other,int param_2)

{
  Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>
  *xpr;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
  *other_00;
  SwapWrapper<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
  local_28;
  int local_1c;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
  *pDStack_18;
  int param_2_local;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
  *other_local;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
  *this_local;
  
  local_1c = param_2;
  pDStack_18 = other;
  other_local = (DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
                 *)this;
  xpr = EigenBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_1,_-1,_false>_>
        ::derived((EigenBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
                   *)this);
  SwapWrapper<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_1,_-1,_false>_>
  ::SwapWrapper(&local_28,xpr);
  other_00 = (DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
              *)EigenBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_1,_-1,_false>_>
                ::derived((EigenBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
                           *)pDStack_18);
  DenseBase<Eigen::SwapWrapper<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,1,-1,false>>>
  ::
  lazyAssign<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,1,_1,false>>
            ((DenseBase<Eigen::SwapWrapper<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,1,_1,false>>>
              *)&local_28,other_00);
  return;
}

Assistant:

void swap(const DenseBase<OtherDerived>& other,
              int = OtherDerived::ThisConstantIsPrivateInPlainObjectBase)
    {
      SwapWrapper<Derived>(derived()).lazyAssign(other.derived());
    }